

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::DeepTiledInputFile
          (DeepTiledInputFile *this,char *fileName,int numThreads)

{
  bool bVar1;
  void *pvVar2;
  _func_int *p_Var3;
  undefined8 uVar4;
  GenericInputFile *in_RDI;
  stringstream _iex_replace_s;
  int *in_stack_00000120;
  IStream *in_stack_00000128;
  GenericInputFile *in_stack_00000130;
  DeepTiledInputFile *in_stack_000001b0;
  BaseExc *e;
  IStream *is;
  int *in_stack_000003d0;
  IStream *in_stack_000003d8;
  Header *in_stack_000003e0;
  InputStreamMutex *in_stack_fffffffffffffdc0;
  IStream *in_stack_fffffffffffffdd8;
  DeepTiledInputFile *in_stack_fffffffffffffde0;
  undefined6 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  StdIFStream *in_stack_fffffffffffffdf0;
  IStream *in_stack_fffffffffffffdf8;
  TileOffsets *in_stack_fffffffffffffe00;
  Data *this_00;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepTiledInputFile_00441a90;
  this_00 = (Data *)(in_RDI + 1);
  pvVar2 = operator_new(0x1e8);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  (this_00->super_Mutex).super___mutex_base._M_mutex.__align = (long)pvVar2;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x3c) = 1;
  pvVar2 = operator_new(0x38);
  StdIFStream::StdIFStream
            (in_stack_fffffffffffffdf0,
             (char *)CONCAT17(in_stack_fffffffffffffdef,
                              CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000130,in_stack_00000128,in_stack_00000120);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xe));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  else {
    p_Var3 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffdc0);
    in_RDI[1]._vptr_GenericInputFile[0x3b] = p_Var3;
    *(void **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) = pvVar2;
    Header::readFrom(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
    initialize(in_stack_000001b0);
    TileOffsets::readFrom
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(bool *)in_stack_fffffffffffffdf0
               ,(bool)in_stack_fffffffffffffdef,(bool)in_stack_fffffffffffffdee);
    uVar4 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) + 0x28))();
    *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x30) = uVar4;
  }
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (const char fileName[], int numThreads):
    _data (new Data (numThreads))
{
    _data->_deleteStream=true;
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //

    IStream* is = 0;
    try
    {
        is = new StdIFStream (fileName);
        readMagicNumberAndVersionField(*is, _data->version);

        //
        // Compatibility to read multpart file.
        //
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(*is);
        }
        else
        {
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,true);
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data && !_data->multiPartBackwardSupport && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (is)          delete is;
        if (_data && !_data->multiPartBackwardSupport && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;

        throw;
    }
}